

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_compare(lua_State *L,int index1,int index2,int op)

{
  TValue *t1;
  TValue *t2;
  int local_34;
  int i;
  StkId o2;
  StkId o1;
  int op_local;
  int index2_local;
  int index1_local;
  lua_State *L_local;
  
  local_34 = 0;
  t1 = index2addr(L,index1);
  t2 = index2addr(L,index2);
  if ((t1 != &luaO_nilobject_) && (t2 != &luaO_nilobject_)) {
    if (op == 0) {
      local_34 = luaV_equalobj(L,t1,t2);
    }
    else if (op == 1) {
      local_34 = luaV_lessthan(L,t1,t2);
    }
    else if (op == 2) {
      local_34 = luaV_lessequal(L,t1,t2);
    }
  }
  return local_34;
}

Assistant:

LUA_API int lua_compare (lua_State *L, int index1, int index2, int op) {
  StkId o1, o2;
  int i = 0;
  lua_lock(L);  /* may call tag method */
  o1 = index2addr(L, index1);
  o2 = index2addr(L, index2);
  if (isvalid(o1) && isvalid(o2)) {
    switch (op) {
      case LUA_OPEQ: i = luaV_equalobj(L, o1, o2); break;
      case LUA_OPLT: i = luaV_lessthan(L, o1, o2); break;
      case LUA_OPLE: i = luaV_lessequal(L, o1, o2); break;
      default: api_check(L, 0, "invalid option");
    }
  }
  lua_unlock(L);
  return i;
}